

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

CopyForm1 __thiscall
ImageTypeManager::convert(ImageTypeManager *this,uint8_t typeIn,uint8_t typeOut)

{
  bool bVar1;
  iterator this_00;
  undefined8 uVar2;
  pointer ppVar3;
  const_iterator copy;
  map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
  *in_stack_ffffffffffffffa8;
  _Self local_30;
  char *in_stack_ffffffffffffffd8;
  _Rb_tree_const_iterator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>
  local_18;
  uchar local_a;
  uchar local_9 [9];
  
  std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char_&,_unsigned_char_&,_true>
            ((pair<unsigned_char,_unsigned_char> *)&stack0xffffffffffffffde,local_9,&local_a);
  this_00 = std::
            map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
            ::find(in_stack_ffffffffffffffa8,(key_type *)0x10fcbc);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>
  ::_Rb_tree_const_iterator(&local_18,(iterator *)&stack0xffffffffffffffe0);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&),_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>_>
       ::cend(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==(&local_18,&local_30);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_void_(*)(const_PenguinV_Image::ImageTemplate<unsigned_char>_&,_PenguinV_Image::ImageTemplate<unsigned_char>_&)>_>
                           *)0x10fd54);
    return (CopyForm1)ppVar3->second;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)this_00._M_node,in_stack_ffffffffffffffd8);
  __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

Image_Function_Helper::FunctionTable::CopyForm1 ImageTypeManager::convert( uint8_t typeIn, uint8_t typeOut )
{
    std::map< std::pair<uint8_t, uint8_t>, Image_Function_Helper::FunctionTable::CopyForm1 >::const_iterator copy =
        _intertypeConvertMap.find( std::pair<uint8_t, uint8_t>( typeIn, typeOut ) );
    if ( copy == _intertypeConvertMap.cend() )
        throw imageException( "Copy function between different image types is not registered" );

    return copy->second;
}